

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_addVariablesWithAndWithoutNameAndUnits_Test::
Variable_addVariablesWithAndWithoutNameAndUnits_Test
          (Variable_addVariablesWithAndWithoutNameAndUnits_Test *this)

{
  Variable_addVariablesWithAndWithoutNameAndUnits_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Variable_addVariablesWithAndWithoutNameAndUnits_Test_0015ad78;
  return;
}

Assistant:

TEST(Variable, addVariablesWithAndWithoutNameAndUnits)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable name=\"var1\" units=\"dimensionless\"/>\n"
        "    <variable name=\"var2\"/>\n"
        "    <variable units=\"dimensionless\"/>\n"
        "    <variable/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("var1");
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("var2");
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();

    c->addVariable(v1);
    c->addVariable(v2);
    c->addVariable(v3);
    c->addVariable(v4);

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("dimensionless");
    v1->setUnits(u);
    v3->setUnits(u);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}